

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

void make_constructors(GlobalVars *gv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  node *__s2;
  node *pnVar5;
  uint8_t *puVar6;
  LinkFile *lf;
  ObjectUnit *ou;
  long lVar7;
  long lVar8;
  node *pnVar9;
  int cnt;
  node *pnVar10;
  node *pnVar11;
  node *pnVar12;
  long lVar13;
  size_t size;
  
  if (gv->dest_object != 0) {
    return;
  }
  if (gv->ctor_symbol == (Symbol *)0x0) {
    if (gv->dtor_symbol == (Symbol *)0x0) {
      return;
    }
LAB_00110c26:
    __s2 = (node *)0x0;
    bVar2 = false;
  }
  else {
    if ((gv->ctor_symbol->flags & 2) == 0) goto LAB_00110c26;
    pnVar5 = (gv->pripointers).first;
    pnVar12 = pnVar5->next;
    if (pnVar12 == (node *)0x0) {
LAB_00110c40:
      __s2 = (node *)xtors_secname(gv,".ctors");
      bVar2 = true;
    }
    else {
      pnVar9 = (node *)0x0;
      do {
        pnVar10 = pnVar12;
        iVar3 = strcmp((char *)pnVar5[1].pred,gv->ctor_symbol->name);
        __s2 = pnVar9;
        if (((iVar3 == 0) && (__s2 = pnVar5[1].next, pnVar9 != (node *)0x0)) &&
           (iVar3 = strcmp((char *)pnVar9,(char *)__s2), __s2 = pnVar9, iVar3 != 0)) {
          error(0x7d);
          pnVar10 = pnVar5->next;
        }
        pnVar9 = __s2;
        pnVar12 = pnVar10->next;
        pnVar5 = pnVar10;
      } while (pnVar10->next != (node *)0x0);
      bVar2 = true;
      if (__s2 == (node *)0x0) goto LAB_00110c40;
    }
  }
  if ((gv->dtor_symbol == (Symbol *)0x0) || ((gv->dtor_symbol->flags & 2) == 0)) {
    if (!bVar2) {
      return;
    }
    bVar1 = false;
    pnVar5 = (node *)0x0;
  }
  else {
    pnVar12 = (gv->pripointers).first;
    pnVar9 = pnVar12->next;
    if (pnVar9 != (node *)0x0) {
      pnVar10 = (node *)0x0;
      do {
        pnVar11 = pnVar9;
        iVar3 = strcmp((char *)pnVar12[1].pred,gv->dtor_symbol->name);
        pnVar5 = pnVar10;
        if (((iVar3 == 0) && (pnVar5 = pnVar12[1].next, pnVar10 != (node *)0x0)) &&
           (iVar3 = strcmp((char *)pnVar10,(char *)pnVar5), pnVar5 = pnVar10, iVar3 != 0)) {
          error(0x7d);
          pnVar11 = pnVar12->next;
        }
        pnVar10 = pnVar5;
        pnVar9 = pnVar11->next;
        pnVar12 = pnVar11;
      } while (pnVar11->next != (node *)0x0);
      bVar1 = true;
      if (pnVar5 != (node *)0x0) goto LAB_00110cfd;
    }
    pnVar5 = (node *)xtors_secname(gv,".dtors");
    bVar1 = true;
  }
LAB_00110cfd:
  pnVar12 = (gv->pripointers).first;
  pnVar9 = pnVar12->next;
  if (pnVar9 == (node *)0x0) {
    iVar3 = 0;
    cnt = 0;
  }
  else {
    cnt = 0;
    iVar3 = 0;
    do {
      pnVar10 = pnVar9;
      if (bVar2) {
        iVar4 = strcmp((char *)pnVar12[1].pred,gv->ctor_symbol->name);
        cnt = cnt + (uint)(iVar4 == 0);
      }
      if (bVar1) {
        iVar4 = strcmp((char *)pnVar12[1].pred,gv->dtor_symbol->name);
        iVar3 = iVar3 + (uint)(iVar4 == 0);
      }
      pnVar9 = pnVar10->next;
      pnVar12 = pnVar10;
    } while (pnVar9 != (node *)0x0);
  }
  lVar7 = (long)(cnt + 2);
  if (!bVar2) {
    lVar7 = 0;
  }
  lVar8 = (long)((char)(((byte)(fff[gv->dest_format]->addr_bits >> 7) >> 5) +
                       fff[gv->dest_format]->addr_bits) >> 3);
  lVar13 = (long)(iVar3 + 2);
  if (!bVar1) {
    lVar13 = 0;
  }
  size = (lVar13 + lVar7) * lVar8;
  puVar6 = (uint8_t *)alloczero(size);
  lf = (LinkFile *)alloczero(0x40);
  lf->objname = "INITEXIT";
  lf->filename = "INITEXIT";
  lf->pathname = "INITEXIT";
  lf->data = puVar6;
  lf->length = size;
  lf->format = gv->dest_format;
  lf->type = '\x03';
  ou = create_objunit(gv,lf,"INITEXIT");
  if (bVar2) {
    write_constructors(gv,ou,gv->ctor_symbol,cnt,0,(char *)__s2);
  }
  if (bVar1) {
    write_constructors(gv,ou,gv->dtor_symbol,iVar3,lVar7 * lVar8,(char *)pnVar5);
  }
  ou->lnkfile->type = '\x01';
  add_objunit(gv,ou,0);
  return;
}

Assistant:

void make_constructors(struct GlobalVars *gv)
/* Create an artificial object for constructor/destructor lists
   and fill them will entries from the PriPointer list. */
{
  if (!gv->dest_object && (gv->ctor_symbol || gv->dtor_symbol)) {
    int nctors=0,ndtors=0;
    bool ctors=FALSE,dtors=FALSE;
    const char *csecname=NULL,*dsecname=NULL;
    unsigned long clen,dlen;
    struct PriPointer *pp;
    uint8_t *data;
    struct ObjectUnit *ou;

    /* check if constructors or destructors are needed (referenced) */
    if (gv->ctor_symbol) {
      if (gv->ctor_symbol->flags & SYMF_REFERENCED) {
        ctors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->ctor_symbol->name)) {
            if (csecname) {
              if (strcmp(csecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              csecname = pp->secname;
          }
        }
        if (!csecname)
          csecname = xtors_secname(gv,ctors_name);
      }
    }
    if (gv->dtor_symbol) {
      if (gv->dtor_symbol->flags & SYMF_REFERENCED) {
        dtors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->dtor_symbol->name)) {
            if (dsecname) {
              if (strcmp(dsecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              dsecname = pp->secname;
          }
        }
        if (!dsecname)
          dsecname = xtors_secname(gv,dtors_name);
      }
    }
    if (!ctors && !dtors)
      return;

    /* count number of constructor and destructor pointers */
    for (pp=(struct PriPointer *)gv->pripointers.first;
         pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
      if (ctors) {
        if (!strcmp(pp->listname,gv->ctor_symbol->name))
          nctors++;
      }
      if (dtors) {
        if (!strcmp(pp->listname,gv->dtor_symbol->name))
          ndtors++;
      }
    }

    /* create artificial object */
    clen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (ctors ? nctors+2 : 0);
    dlen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (dtors ? ndtors+2 : 0);
    data = alloczero(clen + dlen);
    ou = art_objunit(gv,"INITEXIT",data,clen+dlen);

    /* write constructors/destructors */
    if (ctors)
      write_constructors(gv,ou,gv->ctor_symbol,nctors,0,csecname);
    if (dtors)
      write_constructors(gv,ou,gv->dtor_symbol,ndtors,clen,dsecname);

    /* enqueue artificial object unit into linking process */
    ou->lnkfile->type = ID_OBJECT;
    add_objunit(gv,ou,FALSE);
  }
}